

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

int WebPPictureHasTransparency(WebPPicture *picture)

{
  int iVar1;
  uint8_t *alpha;
  int height;
  int y_step;
  int iStack_8;
  
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if (picture->use_argb == 0) {
    alpha = picture->a;
    iVar1 = picture->width;
    height = picture->height;
    y_step = picture->a_stride;
    iStack_8 = 1;
  }
  else {
    if (picture->argb == (uint32_t *)0x0) {
      return 0;
    }
    alpha = (uint8_t *)((long)picture->argb + 3);
    iVar1 = picture->width;
    height = picture->height;
    y_step = picture->argb_stride << 2;
    iStack_8 = 4;
  }
  iVar1 = CheckNonOpaque(alpha,iVar1,height,iStack_8,y_step);
  return iVar1;
}

Assistant:

int WebPPictureHasTransparency(const WebPPicture* picture) {
  if (picture == NULL) return 0;
  if (picture->use_argb) {
    if (picture->argb != NULL) {
      return CheckNonOpaque((const uint8_t*)picture->argb + ALPHA_OFFSET,
                            picture->width, picture->height,
                            4, picture->argb_stride * sizeof(*picture->argb));
    }
    return 0;
  }
  return CheckNonOpaque(picture->a, picture->width, picture->height,
                        1, picture->a_stride);
}